

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

void Dar_LibObjPrint_rec(Dar_LibObj_t *pObj)

{
  int __c;
  Dar_LibObj_t DVar1;
  
  if ((pObj->field_0x4 & 8) == 0) {
    putchar(0x28);
    Dar_LibObjPrint_rec(s_DarLib->pObjs + *(ushort *)pObj);
    DVar1 = *pObj;
    if (((ulong)DVar1 >> 0x20 & 1) != 0) {
      putchar(0x27);
      DVar1 = *pObj;
    }
    Dar_LibObjPrint_rec((Dar_LibObj_t *)
                        (&s_DarLib->pObjs->field_0x0 + ((uint)((ulong)DVar1 >> 0xd) & 0x7fff8)));
    __c = 0x29;
    if (((ulong)*pObj & 0x100000000) != 0) {
      putchar(0x27);
    }
  }
  else {
    __c = (int)((ulong)((long)pObj - (long)s_DarLib->pObjs) >> 3) + 0x61;
  }
  putchar(__c);
  return;
}

Assistant:

void Dar_LibObjPrint_rec( Dar_LibObj_t * pObj )
{
    if ( pObj->fTerm )
    {
        printf( "%c", 'a' + (int)(pObj - s_DarLib->pObjs) );
        return;
    }
    printf( "(" );
    Dar_LibObjPrint_rec( Dar_LibObj(s_DarLib, pObj->Fan0) );
    if ( pObj->fCompl0 )
        printf( "\'" );
    Dar_LibObjPrint_rec( Dar_LibObj(s_DarLib, pObj->Fan1) );
    if ( pObj->fCompl0 )
        printf( "\'" );
    printf( ")" );
}